

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O1

bool __thiscall
SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>::Prepend
          (SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *this,Recycler *allocator,
          JSONObjectProperty *data)

{
  SListNodeBase<Memory::Recycler> *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  Recycler *this_00;
  undefined4 *puVar5;
  SListNodeBase<Memory::Recycler> *addr;
  undefined1 local_50 [8];
  TrackAllocData data_1;
  
  local_50 = (undefined1  [8])&SListNode<Js::JSONObjectProperty,Memory::Recycler>::typeinfo;
  data_1.typeinfo = (type_info *)0x0;
  data_1.plusSize = 0xffffffffffffffff;
  data_1.count = (size_t)anon_var_dwarf_1258d2;
  data_1.filename._0_4_ = 0x13b;
  this_00 = Memory::Recycler::TrackAllocInfo(allocator,(TrackAllocData *)local_50);
  BVar4 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1ef,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar3) goto LAB_00b7796c;
    *puVar5 = 0;
  }
  addr = (SListNodeBase<Memory::Recycler> *)
         Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                   (this_00,0x28);
  if (addr == (SListNodeBase<Memory::Recycler> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1f2,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) {
LAB_00b7796c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  (addr->next).ptr = (SListNodeBase<Memory::Recycler> *)0x0;
  Js::JSONObjectProperty::JSONObjectProperty((JSONObjectProperty *)(addr + 1),data);
  pSVar1 = (this->super_SListNodeBase<Memory::Recycler>).next.ptr;
  Memory::Recycler::WBSetBit((char *)addr);
  (addr->next).ptr = pSVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  Memory::Recycler::WBSetBit((char *)this);
  (this->super_SListNodeBase<Memory::Recycler>).next.ptr = addr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  (this->super_RealCount).count = (this->super_RealCount).count + 1;
  return true;
}

Assistant:

bool Prepend(TAllocator * allocator, TData const& data)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, data);
        if (newNode)
        {
            newNode->Next() = this->Next();
            this->Next() = newNode;
            this->IncrementCount();
            return true;
        }
        return false;
    }